

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O3

int OpenSSLWrapper::SslServerContext::ALPN_CB
              (SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  long *plVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  undefined8 *puVar9;
  byte *pbVar10;
  string strProtokoll;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  undefined8 *local_58;
  uchar **local_50;
  byte *local_48;
  byte *local_40;
  undefined8 *local_38;
  
  if (((out != (uchar **)0x0) && (in != (uchar *)0x0)) && (arg != (void *)0x0)) {
    puVar9 = *(undefined8 **)((long)arg + 0x48);
    local_58 = *(undefined8 **)((long)arg + 0x50);
    local_50 = out;
    local_48 = outlen;
    local_40 = in;
    if (puVar9 != local_58) {
      do {
        uVar7 = 0;
        pbVar10 = in;
        local_38 = puVar9;
        while (local_78 = local_68, uVar7 < inlen) {
          pbVar1 = in + 1;
          bVar2 = *in;
          in = in + (ulong)bVar2 + 1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pbVar1,in);
          sVar5 = local_70;
          plVar4 = local_78;
          if (local_70 == 0) {
            if (puVar9[1] != 0) goto LAB_00121983;
LAB_00121962:
            *local_50 = pbVar1;
            *local_48 = bVar2;
            bVar3 = true;
            in = pbVar1;
          }
          else {
            sVar8 = 0;
            do {
              iVar6 = tolower((int)*(char *)((long)plVar4 + sVar8));
              puVar9 = local_38;
              pbVar10 = local_40;
              *(char *)((long)plVar4 + sVar8) = (char)iVar6;
              sVar8 = sVar8 + 1;
            } while (sVar5 != sVar8);
            if ((local_70 == local_38[1]) &&
               ((local_70 == 0 || (iVar6 = bcmp(local_78,(void *)*local_38,local_70), iVar6 == 0))))
            goto LAB_00121962;
LAB_00121983:
            uVar7 = uVar7 + bVar2 + 1;
            bVar3 = false;
          }
          if (local_78 != local_68) {
            operator_delete(local_78,local_68[0] + 1);
          }
          if (bVar3) {
            return 0;
          }
        }
        puVar9 = puVar9 + 4;
        in = pbVar10;
      } while (puVar9 != local_58);
    }
  }
  return 1;
}

Assistant:

int SslServerContext::ALPN_CB(SSL* /*ssl*/, const unsigned char **out, unsigned char *outlen, const unsigned char *in, unsigned int inlen, void *arg)
    {
        SslServerContext* pSslCtx = static_cast<SslServerContext*>(arg);
        if (pSslCtx == nullptr || in == nullptr || out == nullptr)
            return 1;

        for (auto& strProt : pSslCtx->m_vstrAlpnProtoList)
        {
            const uint8_t* inTmp = in;
            for (unsigned int i = 0; i < inlen;)
            {
                uint8_t nLen = *inTmp++;
                string strProtokoll(reinterpret_cast<const char*>(inTmp), static_cast<size_t>(nLen));
                transform(begin(strProtokoll), end(strProtokoll), begin(strProtokoll), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

                if (strProtokoll == strProt)
                {
                    *out = inTmp, *outlen = nLen;
                    return 0;
                }
                inTmp += nLen;
                i += nLen + 1;
            }
        }

        return 1;
    }